

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

int Abc_NtkFraigStore(Abc_Ntk_t *pNtkAdd)

{
  int iVar1;
  Abc_Ntk_t *pNtkOld;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vStore;
  Abc_Ntk_t *pNtkAdd_local;
  
  pNtkOld = Abc_NtkStrash(pNtkAdd,0,0,0);
  if (pNtkOld == (Abc_Ntk_t *)0x0) {
    printf("Abc_NtkFraigStore: Initial strashing has failed.\n");
    pNtkAdd_local._4_4_ = 0;
  }
  else {
    p = Abc_FrameReadStore();
    iVar1 = Vec_PtrSize(p);
    if (0 < iVar1) {
      pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(p,0);
      iVar1 = Abc_NodeCompareCiCo(pNtkOld,pAVar2);
      if (iVar1 == 0) {
        pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(p,0);
        iVar1 = Abc_NtkCompareSignals(pNtkOld,pAVar2,1,1);
        if (iVar1 == 0) {
          printf("Trying to store the network with different primary inputs.\n");
          printf("The previously stored networks are deleted and this one is added.\n");
          Abc_NtkFraigStoreClean();
        }
      }
    }
    Vec_PtrPush(p,pNtkOld);
    pNtkAdd_local._4_4_ = 1;
  }
  return pNtkAdd_local._4_4_;
}

Assistant:

int Abc_NtkFraigStore( Abc_Ntk_t * pNtkAdd )
{
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk;
    // create the network to be stored
    pNtk = Abc_NtkStrash( pNtkAdd, 0, 0, 0 );
    if ( pNtk == NULL )
    {
        printf( "Abc_NtkFraigStore: Initial strashing has failed.\n" );
        return 0;
    }
    // get the network currently stored
    vStore = Abc_FrameReadStore();
    if ( Vec_PtrSize(vStore) > 0 )
    {
        // check that the networks have the same PIs
        extern int Abc_NodeCompareCiCo( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew );
        if ( !Abc_NodeCompareCiCo(pNtk, (Abc_Ntk_t *)Vec_PtrEntry(vStore, 0)) )
        {
            // reorder PIs of pNtk2 according to pNtk1
            if ( !Abc_NtkCompareSignals( pNtk, (Abc_Ntk_t *)Vec_PtrEntry(vStore, 0), 1, 1 ) )
            {
                printf( "Trying to store the network with different primary inputs.\n" );
                printf( "The previously stored networks are deleted and this one is added.\n" );
                Abc_NtkFraigStoreClean();
            }
        }
    }
    Vec_PtrPush( vStore, pNtk );
//    printf( "The number of AIG nodes added to storage = %5d.\n", Abc_NtkNodeNum(pNtk) );
    return 1;
}